

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs,int nAddOn)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_00571dcd;
  iVar3 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar3] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar3] = p->nTravIds;
  uVar2 = *(ulong *)pObj;
  uVar4 = (uint)uVar2;
  uVar5 = uVar2 & 0x1fffffff;
  if ((int)uVar4 < 0 && uVar5 != 0x1fffffff) {
LAB_00571d4d:
    Rnm_ManCollect_rec(p,pObj + -uVar5,vObjs,nAddOn);
  }
  else {
    if (-1 < (int)uVar4 && (int)uVar5 != 0x1fffffff) {
      Rnm_ManCollect_rec(p,pObj + -uVar5,vObjs,nAddOn);
      uVar5 = (ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      goto LAB_00571d4d;
    }
    if (((~uVar4 & 0x9fffffff) != 0) ||
       ((int)((uint)(uVar2 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x15b,"void Rnm_ManCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
    }
  }
  pObj->Value = nAddOn + vObjs->nSize;
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    Vec_IntPush(vObjs,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
    return;
  }
LAB_00571dcd:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Rnm_ManCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs, int nAddOn )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCo(pObj) )
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
        Rnm_ManCollect_rec( p, Gia_ObjFanin1(pObj), vObjs, nAddOn );
    }
    else if ( !Gia_ObjIsRo(p, pObj) )
        assert( 0 );
    pObj->Value = Vec_IntSize(vObjs) + nAddOn;
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
}